

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

void __thiscall despot::VNode::Free(VNode *this,DSPOMDP *model)

{
  pointer ppSVar1;
  _Base_ptr p_Var2;
  pointer ppQVar3;
  pointer ppQVar4;
  _Rb_tree_header *p_Var5;
  _Self __tmp;
  ulong uVar6;
  
  ppSVar1 = (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppSVar1) {
    uVar6 = 0;
    do {
      (*model->_vptr_DSPOMDP[0x17])(model,ppSVar1[uVar6]);
      uVar6 = uVar6 + 1;
      ppSVar1 = (this->particles_).
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->particles_).
                                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3))
    ;
  }
  ppQVar3 = (this->children_).super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppQVar4 = (this->children_).super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppQVar4 != ppQVar3) {
    uVar6 = 0;
    do {
      p_Var2 = (ppQVar3[uVar6]->children_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var5 = &(ppQVar3[uVar6]->children_)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var2 != p_Var5) {
        do {
          Free((VNode *)p_Var2[1]._M_parent,model);
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
        } while ((_Rb_tree_header *)p_Var2 != p_Var5);
        ppQVar3 = (this->children_).
                  super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppQVar4 = (this->children_).
                  super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)ppQVar4 - (long)ppQVar3 >> 3));
  }
  return;
}

Assistant:

void VNode::Free(const DSPOMDP& model) {
	for (int i = 0; i < particles_.size(); i++) {
		model.Free(particles_[i]);
	}

	for (int a = 0; a < children().size(); a++) {
		QNode* qnode = Child(a);
		map<OBS_TYPE, VNode*>& children = qnode->children();
		for (map<OBS_TYPE, VNode*>::iterator it = children.begin();
			it != children.end(); it++) {
			it->second->Free(model);
		}
	}
}